

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC UINT8_Unmarshal(UINT8 *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  UINT8 *target_local;
  
  if (((target == (UINT8 *)0x0) || (buffer == (BYTE **)0x0)) || (size == (INT32 *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/Marshal.c"
                ,"UINT8_Unmarshal",0x26,1,"invalid paramer specified");
    }
    l._4_4_ = 0x9a;
  }
  else {
    iVar1 = *size;
    *size = iVar1 + -1;
    if (iVar1 + -1 < 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/Marshal.c"
                  ,"UINT8_Unmarshal",0x2d,1,"invalid paramer specified");
      }
      l._4_4_ = 0x9a;
    }
    else {
      *target = **buffer;
      *buffer = *buffer + 1;
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

TPM_RC UINT8_Unmarshal(UINT8 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if (target == NULL || buffer == NULL || size == NULL)
    {
        LogError("invalid paramer specified");
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        if ((*size -= 1) < 0)
        {
            LogError("invalid paramer specified");
            result = TPM_RC_INSUFFICIENT;
        }
        else
        {
            *target = BYTE_ARRAY_TO_UINT8(*buffer);
            *buffer += 1;
            result = TPM_RC_SUCCESS;
        }
    }
    return result;
}